

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minesweeper.cpp
# Opt level: O2

void __thiscall
MinefieldGeneratorTests::TestExpectedGridIsProduced
          (MinefieldGeneratorTests *this,uint8_t w,uint8_t h,string *input,string *expected)

{
  ostream *poVar1;
  stringstream whenDescription;
  string asStack_288 [32];
  _Function_base local_268;
  string local_248 [32];
  _Any_data local_228;
  code *local_218;
  code *local_210;
  undefined1 local_208 [40];
  string local_1e0 [32];
  MinefieldGeneratorTests *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::string::_M_assign((string *)&this->m_expectedGrid);
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar1 = std::operator<<(local_1a8,"generating a field with width ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)w);
  poVar1 = std::operator<<(poVar1," and height ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)h);
  poVar1 = std::operator<<(poVar1," and input of ");
  std::operator<<(poVar1,(string *)input);
  std::__cxx11::stringbuf::str();
  local_208[0] = (_lambda___1_)w;
  local_208[1] = h;
  std::__cxx11::string::string((string *)(local_208 + 8),(string *)input);
  std::__cxx11::string::string(local_1e0,(string *)expected);
  local_1c0 = this;
  std::function<void()>::
  function<MinefieldGeneratorTests::TestExpectedGridIsProduced(unsigned_char,unsigned_char,std::__cxx11::string,std::__cxx11::string)::_lambda()_1_,void>
            ((function<void()> *)&local_268,(anon_class_80_5_0dda5dc8 *)local_208);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[5])
            (this,local_248,&local_268);
  std::_Function_base::~_Function_base(&local_268);
  TestExpectedGridIsProduced(unsigned_char,unsigned_char,std::__cxx11::string,std::__cxx11::string)
  ::{lambda()#1}::~basic_string((_lambda___1_ *)local_208);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::string::string
            (asStack_288,"the expected result was returned",(allocator *)local_208);
  local_228._8_8_ = 0;
  local_210 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/Minesweeper.cpp:100:44)>
              ::_M_invoke;
  local_218 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/Minesweeper.cpp:100:44)>
              ::_M_manager;
  local_228._M_unused._M_object = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,asStack_288);
  std::_Function_base::~_Function_base((_Function_base *)&local_228);
  std::__cxx11::string::~string(asStack_288);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

void TestExpectedGridIsProduced(uint8_t w, uint8_t h, std::string input, std::string expected)
	{
		m_expectedGrid = expected;

		std::stringstream whenDescription;
		whenDescription << "generating a field with width " << (int)w << " and height " << (int)h << " and input of " << input;
		When(whenDescription.str(), [&, w, h, input, expected]() {
			m_expectedGrid = expected;

			minesweeper::MinefieldGenerator generator(w,h);
			m_returnedGrid = generator.GenerateMinefield(input);
		});

		Then("the expected result was returned", [&](){
			AssertThat(m_returnedGrid, ut11::Is::EqualTo(m_expectedGrid));
		});
	}